

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O3

void __thiscall
duckdb_parquet::BloomFilterHeader::BloomFilterHeader
          (BloomFilterHeader *this,BloomFilterHeader *other84)

{
  _BloomFilterAlgorithm__isset *p_Var1;
  _BloomFilterHash__isset *p_Var2;
  _BloomFilterCompression__isset *p_Var3;
  
  *(undefined ***)this = &PTR__BloomFilterHeader_0049d0d8;
  *(undefined ***)&this->algorithm = &PTR__BloomFilterAlgorithm_0049ced0;
  (this->algorithm).BLOCK = (SplitBlockAlgorithm)&PTR__SplitBlockAlgorithm_0049ce68;
  p_Var1 = &(this->algorithm).__isset;
  *p_Var1 = (_BloomFilterAlgorithm__isset)((byte)*p_Var1 & 0xfe);
  *(undefined ***)&this->hash = &PTR__BloomFilterHash_0049cfa0;
  (this->hash).XXHASH = (XxHash)&PTR__XxHash_0049cf38;
  p_Var2 = &(this->hash).__isset;
  *p_Var2 = (_BloomFilterHash__isset)((byte)*p_Var2 & 0xfe);
  *(undefined ***)&this->compression = &PTR__BloomFilterCompression_0049d070;
  (this->compression).UNCOMPRESSED = (Uncompressed)&PTR__Uncompressed_0049d008;
  p_Var3 = &(this->compression).__isset;
  *p_Var3 = (_BloomFilterCompression__isset)((byte)*p_Var3 & 0xfe);
  this->numBytes = other84->numBytes;
  (this->algorithm).__isset = (other84->algorithm).__isset;
  (this->hash).__isset = (other84->hash).__isset;
  (this->compression).__isset = (other84->compression).__isset;
  return;
}

Assistant:

BloomFilterHeader::BloomFilterHeader(const BloomFilterHeader& other84) noexcept {
  numBytes = other84.numBytes;
  algorithm = other84.algorithm;
  hash = other84.hash;
  compression = other84.compression;
}